

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O3

void __thiscall TIFFImageHandler::CalculateTiffTileSize(TIFFImageHandler *this,int inTileIndex)

{
  T2P_TILES *pTVar1;
  tmsize_t tVar2;
  T2P *pTVar3;
  bool bVar4;
  bool bVar5;
  tsize_t_compat *tbc;
  long local_20;
  
  pTVar3 = this->mT2p;
  pTVar1 = pTVar3->tiff_tiles + (ulong)pTVar3->pdf_page * 0x28;
  bVar4 = false;
  if ((inTileIndex + 1U) % *(uint *)(pTVar1 + 0xc) == 0) {
    bVar4 = *(int *)(pTVar1 + 0x14) != 0;
  }
  if (inTileIndex < (int)(*(int *)pTVar1 - *(uint *)(pTVar1 + 0xc))) {
    bVar5 = false;
  }
  else {
    bVar5 = *(int *)(pTVar1 + 0x18) != 0;
  }
  if (pTVar3->pdf_transcode == T2P_TRANSCODE_RAW) {
    if ((bool)(bVar4 | bVar5)) {
      tVar2 = TIFFTileSize(pTVar3->input);
    }
    else {
      local_20 = 0;
      TIFFGetField(pTVar3->input,0x145,&local_20);
      tVar2 = *(tmsize_t *)(local_20 + (long)inTileIndex * 8);
    }
    pTVar3 = this->mT2p;
  }
  else {
    tVar2 = TIFFTileSize(pTVar3->input);
    pTVar3 = this->mT2p;
    pTVar3->tiff_datasize = tVar2;
    if (pTVar3->tiff_planar != 2) {
      return;
    }
    tVar2 = tVar2 * (ulong)pTVar3->tiff_samplesperpixel;
  }
  pTVar3->tiff_datasize = tVar2;
  return;
}

Assistant:

void TIFFImageHandler::CalculateTiffTileSize(int inTileIndex)
{
	uint16_t edge=0;

	edge |= (uint16_t)TileIsRightEdge(inTileIndex);
	edge |= (uint16_t)TileIsBottomEdge(inTileIndex);
	
	if(mT2p->pdf_transcode==T2P_TRANSCODE_RAW)
	{
		if(edge)
		{
			mT2p->tiff_datasize=TIFFTileSize(mT2p->input);
		} else 
		{
			// 	TIFFTAG_TILEBYTECOUNTS changed in tiff 4.0.0;

			tsize_t_compat* tbc = NULL;
			TIFFGetField(mT2p->input, TIFFTAG_TILEBYTECOUNTS, &tbc);
			mT2p->tiff_datasize=static_cast<tsize_t>(tbc[inTileIndex]);
		}
	}
	else
	{
		mT2p->tiff_datasize=TIFFTileSize(mT2p->input);
		if(mT2p->tiff_planar==PLANARCONFIG_SEPARATE)
			mT2p->tiff_datasize*= mT2p->tiff_samplesperpixel;
	}
}